

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::WriteValue<duckdb::ExtensionTypeInfo>(Serializer *this,ExtensionTypeInfo *ptr)

{
  Serializer *in_RSI;
  ExtensionTypeInfo *in_RDI;
  
  if (in_RSI == (Serializer *)0x0) {
    (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                *)((long)&((in_RDI->modifiers).
                           super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                           .
                           super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                           ._M_impl.super__Vector_impl_data._M_start)->label + 0x10))->
              _M_allocated_capacity)(in_RDI,0);
    (**(code **)((long)&((in_RDI->modifiers).
                         super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                         .
                         super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                         ._M_impl.super__Vector_impl_data._M_start)->label + 0x18))();
  }
  else {
    (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                *)((long)&((in_RDI->modifiers).
                           super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                           .
                           super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                           ._M_impl.super__Vector_impl_data._M_start)->label + 0x10))->
              _M_allocated_capacity)(in_RDI,1);
    WriteValue<duckdb::ExtensionTypeInfo>(in_RSI,in_RDI);
    (**(code **)((long)&((in_RDI->modifiers).
                         super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                         .
                         super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                         ._M_impl.super__Vector_impl_data._M_start)->label + 0x18))();
  }
  return;
}

Assistant:

void WriteValue(const T *ptr) {
		if (ptr == nullptr) {
			OnNullableBegin(false);
			OnNullableEnd();
		} else {
			OnNullableBegin(true);
			WriteValue(*ptr);
			OnNullableEnd();
		}
	}